

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O3

LispPTR DSK_renamefile(LispPTR *args)

{
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  FileName *varray;
  char cVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  size_t sVar9;
  int *piVar10;
  uint uVar11;
  DLword *pDVar12;
  char *pcVar13;
  uint unaff_EBP;
  long lVar14;
  char *pcVar15;
  char ver [16];
  char fbuf [4096];
  char dst [4096];
  char dir [4096];
  char src [4096];
  char vless [4096];
  int local_504c;
  char local_5048 [16];
  char local_5038 [4096];
  char local_4038 [4096];
  char local_3038 [4096];
  char local_2038 [4096];
  char local_1038 [4104];
  long lVar8;
  
  iVar6 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar6 != 0) {
    *Lisp_errno = 100;
    return 0;
  }
  uVar11 = args[2];
  if ((uVar11 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar11);
  }
  Lisp_errno = (int *)(Lisp_world + uVar11);
  uVar11 = *args;
  if ((uVar11 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar11);
  }
  if ((char)Lisp_world[(ulong)uVar11 + 3] == 'D') {
    local_504c = *(int *)(Lisp_world + (ulong)uVar11 + 4) * 2;
    uVar11 = *(int *)(Lisp_world + (ulong)uVar11 + 4) * 2 + 5;
    unaff_EBP = 0;
LAB_0011de91:
    if (0x1000 < (int)uVar11) goto LAB_0011df19;
  }
  else {
    if ((char)Lisp_world[(ulong)uVar11 + 3] == 'C') {
      local_504c = *(int *)(Lisp_world + (ulong)uVar11 + 4);
      uVar11 = local_504c + 3;
      unaff_EBP = 1;
      goto LAB_0011de91;
    }
    error("LispStringLength: Not a character array.\n");
  }
  uVar2 = args[1];
  if ((uVar2 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
  }
  if ((char)Lisp_world[(ulong)uVar2 + 3] == 'D') {
    uVar11 = *(int *)(Lisp_world + (ulong)uVar2 + 4) * 2;
LAB_0011df0b:
    local_504c = uVar11 + 5;
  }
  else {
    if ((char)Lisp_world[(ulong)uVar2 + 3] == 'C') {
      uVar11 = *(uint *)(Lisp_world + (ulong)uVar2 + 4);
    }
    else {
      error("LispStringLength: Not a character array.\n");
      if ((unaff_EBP & 1) == 0) goto LAB_0011df0b;
    }
    local_504c = uVar11 + 3;
  }
  if (0x1000 < local_504c) {
LAB_0011df19:
    *Lisp_errno = 200;
    return 0;
  }
  uVar11 = *args;
  if ((uVar11 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar11);
  }
  iVar6 = *(int *)(Lisp_world + (ulong)uVar11 + 4);
  iVar7 = 0x1000;
  if (iVar6 < 0x1000) {
    iVar7 = iVar6;
  }
  lVar8 = (long)iVar7;
  if ((char)Lisp_world[(ulong)uVar11 + 3] == 'D') {
    if (iVar6 == 0) {
      pcVar15 = local_5038;
    }
    else {
      lVar8 = lVar8 + (ulong)(lVar8 == 0);
      pDVar12 = Lisp_world +
                (ulong)Lisp_world[(ulong)uVar11 + 2] +
                (ulong)(*(uint *)(Lisp_world + uVar11) & 0xfffffff);
      pcVar15 = local_5038;
      do {
        *pcVar15 = *(char *)((ulong)pDVar12 ^ 2);
        pcVar15 = pcVar15 + 1;
        pDVar12 = pDVar12 + 1;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    *pcVar15 = '\0';
  }
  else if ((char)Lisp_world[(ulong)uVar11 + 3] == 'C') {
    if (iVar6 != 0) {
      uVar2 = *(uint *)(Lisp_world + uVar11);
      uVar1 = Lisp_world[(ulong)uVar11 + 2];
      lVar14 = 0;
      do {
        local_5038[lVar14] =
             *(char *)((long)Lisp_world + lVar14 + (ulong)uVar1 + (ulong)(uVar2 & 0xfffffff) * 2 ^ 3
                      );
        lVar14 = lVar14 + 1;
      } while (lVar8 + (ulong)(lVar8 == 0) != lVar14);
    }
    local_5038[lVar8] = '\0';
  }
  else {
    error("LispStringToCString: Not a character array.\n");
  }
  pcVar15 = local_5038;
  unixpathname(pcVar15,local_2038,1,0);
  uVar11 = args[1];
  if ((uVar11 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar11);
  }
  iVar6 = *(int *)(Lisp_world + (ulong)uVar11 + 4);
  iVar7 = 0x1000;
  if (iVar6 < 0x1000) {
    iVar7 = iVar6;
  }
  lVar8 = (long)iVar7;
  if ((char)Lisp_world[(ulong)uVar11 + 3] == 'D') {
    if (iVar6 != 0) {
      lVar8 = lVar8 + (ulong)(lVar8 == 0);
      pDVar12 = Lisp_world +
                (ulong)Lisp_world[(ulong)uVar11 + 2] +
                (ulong)(*(uint *)(Lisp_world + uVar11) & 0xfffffff);
      pcVar15 = local_5038;
      do {
        *pcVar15 = *(char *)((ulong)pDVar12 ^ 2);
        pcVar15 = pcVar15 + 1;
        pDVar12 = pDVar12 + 1;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    *pcVar15 = '\0';
  }
  else if ((char)Lisp_world[(ulong)uVar11 + 3] == 'C') {
    if (iVar6 != 0) {
      uVar2 = *(uint *)(Lisp_world + uVar11);
      uVar1 = Lisp_world[(ulong)uVar11 + 2];
      lVar14 = 0;
      do {
        local_5038[lVar14] =
             *(char *)((long)Lisp_world + lVar14 + (ulong)uVar1 + (ulong)(uVar2 & 0xfffffff) * 2 ^ 3
                      );
        lVar14 = lVar14 + 1;
      } while (lVar8 + (ulong)(lVar8 == 0) != lVar14);
    }
    local_5038[lVar8] = '\0';
  }
  else {
    error("LispStringToCString: Not a character array.\n");
  }
  unixpathname(local_5038,local_4038,1,0);
  iVar6 = unpack_filename(local_4038,local_3038,local_5038,local_5048,1);
  if (iVar6 == 0) {
    return 0;
  }
  pcVar15 = local_3038;
  iVar6 = make_directory(pcVar15);
  pcVar13 = pcVar15;
  if (iVar6 == 0) {
    return 0;
  }
  for (; (pcVar5 = pcVar13, *pcVar13 == '/' || (pcVar5 = pcVar15, *pcVar13 != '\0'));
      pcVar13 = pcVar13 + 1) {
    pcVar15 = pcVar5;
  }
  if (pcVar13 + -1 == pcVar15) {
    if (pcVar15 == local_3038) {
      local_4038[0] = '/';
      local_4038[1] = '\0';
    }
    else {
      strcpy(local_4038,local_3038);
    }
  }
  else {
    strcpy(local_4038,local_3038);
    sVar9 = strlen(local_4038);
    (local_4038 + sVar9)[0] = '/';
    (local_4038 + sVar9)[1] = '\0';
  }
  strcat(local_4038,local_5038);
  iVar6 = maintain_version(local_4038,0);
  if (iVar6 == 0) {
    return 0;
  }
  iVar6 = get_version_array(local_3038,local_5038);
  cVar4 = local_5048[0];
  if (iVar6 == 0) {
    return 0;
  }
  strcpy(local_4038,local_5038);
  if (cVar4 != '\0') {
    sVar9 = strlen(local_4038);
    (local_4038 + sVar9)[0] = '.';
    (local_4038 + sVar9)[1] = '~';
    local_4038[sVar9 + 2] = '\0';
    strcat(local_4038,local_5048);
    sVar9 = strlen(local_4038);
    (local_4038 + sVar9)[0] = '~';
    (local_4038 + sVar9)[1] = '\0';
  }
  iVar6 = get_new(local_3038,VA.files,local_4038,local_5038);
  if (iVar6 == 0) {
    return 0;
  }
  if ((VA.files)->version_no == 0xffffffff) goto LAB_0011e459;
  if (((VA.files)->version_no == 0) && (VA.files[1].version_no == 0xffffffff)) {
    get_versionless(VA.files,local_1038,local_3038);
    iVar6 = strcmp(local_4038,local_1038);
    if (iVar6 != 0) {
      strcpy(local_5038,local_1038);
      sVar9 = strlen(local_5038);
      (local_5038 + sVar9)[0] = '.';
      (local_5038 + sVar9)[1] = '~';
      local_5038[sVar9 + 2] = '\0';
      sVar9 = strlen(local_5038);
      (local_5038 + sVar9)[0] = '1';
      (local_5038 + sVar9)[1] = '\0';
      sVar9 = strlen(local_5038);
      (local_5038 + sVar9)[0] = '~';
      (local_5038 + sVar9)[1] = '\0';
      alarm(TIMEOUT_TIME);
      piVar10 = __errno_location();
      do {
        *piVar10 = 0;
        iVar6 = rename(local_1038,local_5038);
        if (iVar6 != -1) goto LAB_0011e452;
      } while (*piVar10 == 4);
      alarm(0);
      iVar6 = *piVar10;
      goto LAB_0011e691;
    }
    goto LAB_0011e459;
  }
  get_versionless(VA.files,local_1038,local_3038);
  iVar6 = check_vless_link(local_1038,VA.files,local_5038,&local_504c);
  if (iVar6 == 0) {
    return 0;
  }
  iVar6 = strcmp(local_4038,local_5038);
  if (iVar6 != 0) goto LAB_0011e459;
  alarm(TIMEOUT_TIME);
  piVar10 = __errno_location();
  do {
    *piVar10 = 0;
    iVar6 = unlink(local_1038);
    if (iVar6 != -1) goto LAB_0011e452;
  } while (*piVar10 == 4);
  goto LAB_0011e685;
LAB_0011e452:
  alarm(0);
LAB_0011e459:
  iVar6 = unpack_filename(local_2038,local_3038,local_5038,local_5048,1);
  if (iVar6 == 0) {
    return 0;
  }
  iVar6 = get_version_array(local_3038,local_5038);
  varray = VA.files;
  if (iVar6 == 0) {
    return 0;
  }
  if ((VA.files)->version_no == 0xffffffff) {
    return 0;
  }
  strcpy(local_2038,local_5038);
  if (local_5048[0] != '\0') {
    sVar9 = strlen(local_2038);
    (local_2038 + sVar9)[0] = '.';
    (local_2038 + sVar9)[1] = '~';
    local_2038[sVar9 + 2] = '\0';
    strcat(local_2038,local_5048);
    sVar9 = strlen(local_2038);
    (local_2038 + sVar9)[0] = '~';
    (local_2038 + sVar9)[1] = '\0';
  }
  iVar6 = get_old(local_3038,varray,local_2038,local_5038);
  if (iVar6 == 0) {
    return 0;
  }
  iVar6 = get_versionless(VA.files,local_1038,local_3038);
  bVar3 = true;
  if (iVar6 != 0) {
    iVar6 = check_vless_link(local_1038,VA.files,local_5038,&local_504c);
    if (iVar6 == 0) {
      return 0;
    }
    iVar6 = strcmp(local_2038,local_1038);
    if ((iVar6 == 0) && (local_5038[0] != '\0')) {
      alarm(TIMEOUT_TIME);
      piVar10 = __errno_location();
      do {
        *piVar10 = 0;
        iVar6 = unlink(local_5038);
        if (iVar6 != -1) goto LAB_0011e637;
      } while (*piVar10 == 4);
    }
    else {
      iVar6 = strcmp(local_2038,local_5038);
      if (iVar6 != 0) goto LAB_0011e642;
      alarm(TIMEOUT_TIME);
      piVar10 = __errno_location();
      do {
        *piVar10 = 0;
        iVar6 = unlink(local_1038);
        if (iVar6 != -1) goto LAB_0011e637;
      } while (*piVar10 == 4);
    }
    alarm(0);
    iVar6 = *piVar10;
    goto LAB_0011e691;
  }
  goto LAB_0011e642;
LAB_0011e637:
  alarm(0);
  bVar3 = false;
LAB_0011e642:
  alarm(TIMEOUT_TIME);
  piVar10 = __errno_location();
  do {
    *piVar10 = 0;
    iVar6 = rename(local_2038,local_4038);
    if (iVar6 != -1) {
      alarm(0);
      iVar6 = maintain_version(local_4038,0);
      if (iVar6 == 0) {
        return 0;
      }
      if ((!bVar3) && (iVar6 = maintain_version(local_2038,0), iVar6 == 0)) {
        return 0;
      }
      return 0x4c;
    }
  } while (*piVar10 == 4);
LAB_0011e685:
  alarm(0);
  iVar6 = *piVar10;
LAB_0011e691:
  *Lisp_errno = iVar6;
  return 0;
}

Assistant:

LispPTR DSK_renamefile(LispPTR *args)
{
  char src[MAXPATHLEN], dst[MAXPATHLEN];
  char fbuf[MAXPATHLEN], vless[MAXPATHLEN], svless[MAXPATHLEN];
  char dir[MAXPATHLEN], ver[VERSIONLEN];
  int rval, fatp;
  int need_maintain_flg;
#ifdef DOS
  char drive1[1], drive2[1];
  int extlen1, extlen2; /* len of extension */
  char rawname1[MAXNAMLEN], rawname2[MAXNAMLEN];
#endif /* DOS */

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[2]);

  LispStringLength(args[0], rval, fatp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  rval = fatp ? rval + 4 + 1 : rval + 2 + 1;
  if (rval > MAXPATHLEN) FileNameTooLong(NIL);

  LispStringLength(args[1], rval, fatp);
  rval = fatp ? rval + 4 + 1 : rval + 2 + 1;
  if (rval > MAXPATHLEN) FileNameTooLong(NIL);

  LispStringToCString(args[0], fbuf, MAXPATHLEN);
#ifdef DOS
  separate_drive(fbuf, drive1);
  unixpathname(fbuf, src, 1, 0, drive1, &extlen1, rawname1);
#else  /* DOS */
  unixpathname(fbuf, src, 1, 0);
#endif /* DOS */

  LispStringToCString(args[1], fbuf, MAXPATHLEN);
#ifdef DOS
  separate_drive(fbuf, drive2);
  unixpathname(fbuf, dst, 1, 0, drive2, &extlen2, rawname2);
#else  /* DOS */
  unixpathname(fbuf, dst, 1, 0);
#endif /* DOS */

  if (unpack_filename(dst, dir, fbuf, ver, 1) == 0) return (NIL);
  /*
   * The destination file has been recognized as new file.  Thus we have
   * to make sure that the directory exists.
   */
  if (make_directory(dir) == 0) return (NIL);

  /*
   * We maintain the destination to handle the link damaged case correctly.
   */
  ConcDirAndName(dir, fbuf, dst);
  if (maintain_version(dst, 0) == 0) return (NIL);

  if (get_version_array(dir, fbuf) == 0) return (NIL);

  /*
   * Although the file should have been recognized with "new" mode in Lisp
   * code, we have to recognize it again to know the "real" accessible name
   * of it.
   */

  ConcNameAndVersion(fbuf, ver, dst);
  if (get_new(dir, VA.files, dst, fbuf) == 0) return (NIL);

  /*
   * At this point, there are three cases for the destination.  If there is
   * no member of the destination family, there is nothing to do.  If there
   * is only a versionless file and, if the "real" destination is not the
   * versionless, we have to rename it to version 1.  And last case, if the
   * "real" destination file is the file to which the versionless file is linked,
   * we have to unlink the versionless file.
   */
  if (!NoFileP(VA.files)) {
    if (OnlyVersionlessP(VA.files)) {
      get_versionless(VA.files, vless, dir);
      if (strcmp(dst, vless) != 0) {
        ConcNameAndVersion(vless, "1", fbuf);
        TIMEOUT(rval = rename(vless, fbuf));
        if (rval == -1) {
          *Lisp_errno = errno;
          return (NIL);
        }
      }
    } else {
      /*
       * We are sure that the versionless file is linked to one of
       * the higher versioned file here.
       */
      get_versionless(VA.files, vless, dir);
      if (check_vless_link(vless, VA.files, fbuf, &rval) == 0) { return (NIL); }
      if (strcmp(dst, fbuf) == 0) {
        TIMEOUT(rval = unlink(vless));
        if (rval == -1) {
          *Lisp_errno = errno;
          return (NIL);
        }
      }
    }
  }

  if (unpack_filename(src, dir, fbuf, ver, 1) == 0) return (NIL);
  if (get_version_array(dir, fbuf) == 0) return (NIL);

  if (NoFileP(VA.files))
    return (NIL); /*
                   * If the specified file is deleted from
                   * outside of Lisp during the last time
                   * Lisp recognize it and now, this case
                   * will occur.
                   */

  /*
   * Although the file should have been recognized with "old" mode in Lisp
   * code, we have to recognize it again to know the "real" accessible name
   * of it.
   */
  ConcNameAndVersion(fbuf, ver, src);
  if (get_old(dir, VA.files, src, fbuf) == 0) return (NIL);

  if (get_versionless(VA.files, vless, dir) == 0) {
    /*
     * There is no versionless file.  All we have to do is to simply
     * try to rename the specified file.
     */
    need_maintain_flg = 0;
  } else {
    /*
     * If a versionless file exists, we have to check the link status
     * of it, because renaming a versionless file or a file to which a
     * versionless file is linked will destroy the consistency of the
     * version status.
     */
    if (check_vless_link(vless, VA.files, fbuf, &rval) == 0) return (NIL);

    if (strcmp(src, vless) == 0 && *fbuf != '\0') {
      /*
       * At this point, we only unlink the file to which the
       * versionless is linked.  The versionless fill will be
       * renamed later.
       */
      TIMEOUT(rval = unlink(fbuf));
      if (rval == -1) {
        *Lisp_errno = errno;
        return (NIL);
      }
      need_maintain_flg = 1;
    } else if (strcmp(src, fbuf) == 0) {
      TIMEOUT(rval = unlink(vless));
      if (rval == -1) {
        *Lisp_errno = errno;
        return (NIL);
      }
      need_maintain_flg = 1;
    } else {
      need_maintain_flg = 0;
    }
    strcpy(svless, vless);
  }

  /*
   * At this point, src holds the full file name to be renamed, and dst holds
   * the full file name to which src will be renamed.
   */

  TIMEOUT(rval = rename(src, dst));
  if (rval == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }

  /*
   * The destination directory always have to be maintained, because it is
   * now under control of DSK device.
   * The source directory have to be maintained only if need_maintain_flg
   * is on.
   */

  if (maintain_version(dst, 0) == 0) return (NIL);
  if (need_maintain_flg) {
    if (maintain_version(src, 0) == 0) return (NIL);
  }

  return (ATOM_T);
}